

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MineFusing.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::MineFusing::MineFusing
          (MineFusing *this,MineFuse Primary,MineFuse Secondary,KBOOL AntiHandlingDevice)

{
  KBOOL AntiHandlingDevice_local;
  MineFuse Secondary_local;
  MineFuse Primary_local;
  MineFusing *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MineFusing_00331268;
  (this->m_FuseUnion).m_ui16Fusing = 0;
  (this->m_FuseUnion).m_ui16Fusing =
       (this->m_FuseUnion).m_ui16Fusing & 0xff80 | (ushort)Primary & 0x7f;
  (this->m_FuseUnion).m_ui16Fusing =
       (this->m_FuseUnion).m_ui16Fusing & 0xc07f | ((ushort)Secondary & 0x7f) << 7;
  (this->m_FuseUnion).m_ui16Fusing =
       (this->m_FuseUnion).m_ui16Fusing & 0xbfff | (ushort)AntiHandlingDevice << 0xe;
  return;
}

Assistant:

MineFusing::MineFusing( MineFuse Primary, MineFuse Secondary, KBOOL AntiHandlingDevice )
{
    m_FuseUnion.m_ui16Fusing = 0;
    m_FuseUnion.m_ui16Primary = Primary;
    m_FuseUnion.m_ui16Secondary = Secondary;
    m_FuseUnion.m_ui16AHD = AntiHandlingDevice;
}